

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall spirv_cross::CompilerMSL::is_patch_block(CompilerMSL *this,SPIRType *type)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock);
  if (bVar1) {
    if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size == 0) {
      bVar1 = true;
    }
    else {
      uVar2 = 0;
      do {
        bVar1 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,(uint32_t)uVar2,
                           DecorationPatch);
        if (!bVar1) {
          return bVar1;
        }
        uVar2 = (ulong)((uint32_t)uVar2 + 1);
      } while (uVar2 < (type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CompilerMSL::is_patch_block(const SPIRType &type)
{
	if (!has_decoration(type.self, DecorationBlock))
		return false;

	for (uint32_t i = 0; i < type.member_types.size(); i++)
	{
		if (!has_member_decoration(type.self, i, DecorationPatch))
			return false;
	}

	return true;
}